

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

double filter_bspline(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = 0.0;
  if (x <= 2.0) {
    dVar1 = x + -1.0;
    dVar2 = x + 1.0;
    dVar3 = x + 2.0;
    dVar1 = ((double)(-(ulong)(0.0 < dVar1) & (ulong)(dVar1 * dVar1 * dVar1)) * -4.0 +
            (double)(-(ulong)(0.0 < x) & (ulong)(x * x * x)) * 6.0 +
            (double)(-(ulong)(0.0 < dVar2) & (ulong)(dVar2 * dVar2 * dVar2)) * -4.0 +
            (double)(-(ulong)(0.0 < dVar3) & (ulong)(dVar3 * dVar3 * dVar3))) * 0.1666666716337204;
  }
  return dVar1;
}

Assistant:

static double filter_bspline(const double x)
{
	if (x>2.0f) {
		return 0.0f;
	} else {
		double a, b, c, d;
		/* Was calculated anyway cause the "if((x-1.0f) < 0)" */
		const double xm1 = x - 1.0f;
		const double xp1 = x + 1.0f;
		const double xp2 = x + 2.0f;

		if ((xp2) <= 0.0f) a = 0.0f; else a = xp2*xp2*xp2;
		if ((xp1) <= 0.0f) b = 0.0f; else b = xp1*xp1*xp1;
		if (x <= 0) c = 0.0f; else c = x*x*x;
		if ((xm1) <= 0.0f) d = 0.0f; else d = xm1*xm1*xm1;

		return (0.16666666666666666667f * (a - (4.0f * b) + (6.0f * c) - (4.0f * d)));
	}
}